

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O0

char * json::load<obj_var1>(char *in,size_t len,obj_var1 *t,int options)

{
  bool bVar1;
  char *pcVar2;
  undefined1 local_25f8 [8];
  LoadObject serializer;
  size_t props_size;
  prop_map props;
  char *start;
  int options_local;
  obj_var1 *t_local;
  size_t len_local;
  char *in_local;
  
  serializer._prev_name = (char *)0x0;
  props[299].value.len = (size_t)in;
  pcVar2 = skip_ws(in);
  if (*pcVar2 == '{') {
    pcVar2 = load_props(pcVar2 + 1,(char *)(props[299].value.len + len),(prop_map *)&props_size,
                        (size_t *)&serializer._prev_name);
    if (*pcVar2 == '}') {
      std::sort<json::property*,bool(*)(json::property_const&,json::property_const&)>
                ((property *)&props_size,
                 (property *)&props[(long)(serializer._prev_name + -1)].value.len,compare_props);
      LoadObject::LoadObject
                ((LoadObject *)local_25f8,(prop_map *)&props_size,(size_t)serializer._prev_name,
                 (char *)props[299].value.len,options);
      bVar1 = serialize<json::LoadObject>((LoadObject *)local_25f8,t);
      if (bVar1) {
        if (serializer.props_size < serializer.props) {
          in_local = (char *)props[serializer.props_size - 1].value.len;
        }
        else {
          in_local = skip_ws(pcVar2 + 1);
        }
      }
      else {
        in_local = (char *)serializer._24_8_;
      }
    }
    else {
      in_local = pcVar2 + -1;
    }
  }
  else {
    in_local = pcVar2 + -1;
  }
  return in_local;
}

Assistant:

const char* load(const char* in, size_t len, V& t, int options) {
	const char* start = in;
	prop_map props;
	size_t props_size = 0;
	in = skip_ws(in);

	if (*in != '{')
		return in - 1;										 // error
	in = load_props(in + 1, start + len, props, props_size); // load prop map for child object
	if (*in != '}')
		return in - 1; // error

	std::sort(props, props + props_size, compare_props);

	LoadObject serializer(props, props_size, start, options);
	if (!serialize(serializer, t))
		return serializer.error_pos;

	if (serializer.current < serializer.props_size)
		return props[serializer.current].param.str;

	in = skip_ws(in + 1); // skip whitespace after
	return in;
}